

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,LogicalExpression *expression)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  VariableValue *pVVar8;
  PrimitiveSimpleObject *pPVar9;
  Type *pTVar10;
  Value *pVVar11;
  undefined8 extraout_RAX;
  string *psVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  allocator<char> local_c9;
  NewFunctionProcessingVisitor *local_c8;
  uint local_bc;
  PrimitiveSimpleObject *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  psVar12 = &expression->operation_;
  bVar3 = std::operator==(psVar12,"true");
  if (bVar3) {
    pVVar8 = (VariableValue *)operator_new(0x50);
    pPVar9 = (PrimitiveSimpleObject *)operator_new(0x18);
    pTVar10 = (Type *)operator_new(0x28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"boolean",&local_c9);
    Type::Type(pTVar10,&local_50);
    PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar9,pTVar10);
    VariableValue::VariableValue(pVVar8,pPVar9,1);
    (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar8;
    psVar12 = &local_50;
  }
  else {
    bVar3 = std::operator==(psVar12,"false");
    if (bVar3) {
      pVVar8 = (VariableValue *)operator_new(0x50);
      pPVar9 = (PrimitiveSimpleObject *)operator_new(0x18);
      pTVar10 = (Type *)operator_new(0x28);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"boolean",&local_c9);
      Type::Type(pTVar10,&local_70);
      PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar9,pTVar10);
      VariableValue::VariableValue(pVVar8,pPVar9,0);
      (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar8;
      psVar12 = &local_70;
    }
    else if (&expression->lhs_->super_Node == (Node *)0x0) {
      pVVar11 = TemplateVisitor<Value_*>::Accept
                          (&this->super_TemplateVisitor<Value_*>,&expression->rhs_->super_Node);
      iVar6 = (*pVVar11->_vptr_Value[2])(pVVar11);
      pVVar8 = (VariableValue *)operator_new(0x50);
      local_b8 = (PrimitiveSimpleObject *)operator_new(0x18);
      pTVar10 = (Type *)operator_new(0x28);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"boolean",&local_c9);
      pPVar9 = local_b8;
      local_bc = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      Type::Type(pTVar10,&local_90);
      PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar9,pTVar10);
      local_bc = 0;
      VariableValue::VariableValue(pVVar8,pPVar9,(uint)(iVar6 == 0));
      (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar8;
      psVar12 = &local_90;
    }
    else {
      pVVar11 = TemplateVisitor<Value_*>::Accept
                          (&this->super_TemplateVisitor<Value_*>,&expression->lhs_->super_Node);
      iVar6 = (*pVVar11->_vptr_Value[2])(pVVar11);
      pVVar11 = TemplateVisitor<Value_*>::Accept
                          (&this->super_TemplateVisitor<Value_*>,&expression->rhs_->super_Node);
      iVar7 = (*pVVar11->_vptr_Value[2])(pVVar11);
      bVar3 = std::operator==(psVar12,"&&");
      local_c8 = this;
      bVar4 = std::operator==(psVar12,"||");
      bVar3 = bVar3 && (iVar7 != 0 && iVar6 != 0);
      if (bVar4) {
        bVar3 = iVar7 != 0 || iVar6 != 0;
      }
      local_b8._0_4_ = iVar7;
      bVar5 = std::operator==(psVar12,"<");
      bVar15 = iVar6 == (uint)local_b8;
      bVar4 = iVar6 < (int)(uint)local_b8;
      bVar1 = iVar6 <= (int)(uint)local_b8;
      bVar2 = (int)(uint)local_b8 <= iVar6;
      local_bc = (uint)((int)(uint)local_b8 <= iVar6);
      local_b8 = (PrimitiveSimpleObject *)CONCAT44(local_b8._4_4_,(uint)bVar15);
      if (!bVar5) {
        bVar4 = bVar3;
      }
      bVar3 = std::operator==(psVar12,"<=");
      if (bVar3) {
        bVar4 = bVar1;
      }
      bVar3 = std::operator==(psVar12,">");
      if (bVar3) {
        bVar4 = !bVar15 && bVar2;
      }
      bVar3 = std::operator==(psVar12,">=");
      uVar13 = (uint)bVar4;
      if (bVar3) {
        uVar13 = local_bc;
      }
      bVar3 = std::operator==(psVar12,"==");
      if (bVar3) {
        uVar13 = (uint)local_b8;
      }
      bVar3 = std::operator==(psVar12,"!=");
      uVar14 = (uint)!bVar15;
      if (!bVar3) {
        uVar14 = uVar13;
      }
      pVVar8 = (VariableValue *)operator_new(0x50);
      pPVar9 = (PrimitiveSimpleObject *)operator_new(0x18);
      pTVar10 = (Type *)operator_new(0x28);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"boolean",&local_c9);
      Type::Type(pTVar10,&local_b0);
      PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar9,pTVar10);
      VariableValue::VariableValue(pVVar8,pPVar9,uVar14 & 1);
      (local_c8->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar8;
      psVar12 = &local_b0;
    }
  }
  std::__cxx11::string::~string((string *)psVar12);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(LogicalExpression* expression) {
  if (expression->operation_ == "true") {
    tos_value_ =
        new VariableValue(new PrimitiveSimpleObject(new Type("boolean")), 1);
  } else if (expression->operation_ == "false") {
    tos_value_ =
        new VariableValue(new PrimitiveSimpleObject(new Type("boolean")), 0);
  } else if (expression->lhs_ == nullptr) {
    auto value = Accept(expression->rhs_)->GetValue();
    tos_value_ = new VariableValue(
        new PrimitiveSimpleObject(new Type("boolean")), !value);
  } else {
    auto lhs = Accept(expression->lhs_)->GetValue();
    auto rhs = Accept(expression->rhs_)->GetValue();
    bool result = false;
    if (expression->operation_ == "&&") {
      result = lhs && rhs;
    }
    if (expression->operation_ == "||") {
      result = lhs || rhs;
    }
    if (expression->operation_ == "<") {
      result = lhs < rhs;
    }
    if (expression->operation_ == "<=") {
      result = lhs <= rhs;
    }
    if (expression->operation_ == ">") {
      result = lhs > rhs;
    }
    if (expression->operation_ == ">=") {
      result = lhs >= rhs;
    }
    if (expression->operation_ == "==") {
      result = lhs == rhs;
    }
    if (expression->operation_ == "!=") {
      result = lhs != rhs;
    }

    tos_value_ = new VariableValue(
        new PrimitiveSimpleObject(new Type("boolean")), result);
  }
}